

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::matrix4d>
          (Attribute *this,double t,matrix4d *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *__src;
  optional<tinyusdz::value::matrix4d> local_148;
  undefined1 local_c0 [8];
  optional<tinyusdz::value::matrix4d> v;
  TimeSampleInterpolationType tinterp_local;
  matrix4d *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (matrix4d *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 0x78),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 0x78));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_148,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
      optional<tinyusdz::value::matrix4d,_0>
                ((optional<tinyusdz::value::matrix4d> *)local_c0,&local_148);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional(&local_148);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_c0);
      if (bVar1) {
        __src = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                          ((optional<tinyusdz::value::matrix4d> *)local_c0);
        memcpy(dst,__src,0x80);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
                ((optional<tinyusdz::value::matrix4d> *)local_c0);
      if (bVar1) goto LAB_002e1762;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4d>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::matrix4d>(this,dst);
    }
  }
LAB_002e1762:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }